

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QObject ** __thiscall QHash<QObject_*,_int>::keyImpl(QHash<QObject_*,_int> *this,int *value)

{
  Span *pSVar1;
  ulong uVar2;
  Entry *pEVar3;
  Data *pDVar4;
  ulong uVar5;
  bool bVar6;
  
  pDVar4 = this->d;
  if (pDVar4 != (Data *)0x0) {
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (pDVar4->numBuckets == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar2 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    }
    else {
      uVar5 = 0;
    }
    pEVar3 = (Entry *)(uVar5 | (ulong)pDVar4);
    bVar6 = pEVar3 == (Entry *)0x0;
    if (!bVar6) {
      do {
        pSVar1 = pDVar4->spans;
        if (*(int *)(pSVar1[uVar5 >> 7].entries[pSVar1[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].
                     storage.data + 8) == *value) {
          pEVar3 = pSVar1[uVar5 >> 7].entries + pSVar1[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f];
          break;
        }
        do {
          if (pDVar4->numBuckets - 1 == uVar5) {
            uVar5 = 0;
            pDVar4 = (Data *)0x0;
            break;
          }
          uVar5 = uVar5 + 1;
        } while (pSVar1[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
        pEVar3 = (Entry *)(uVar5 | (ulong)pDVar4);
        bVar6 = pEVar3 == (Entry *)0x0;
      } while (!bVar6);
    }
    if (!bVar6) {
      return (QObject **)pEVar3;
    }
  }
  return (QObject **)0x0;
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }